

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::expRightToLeft(BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod)

{
  pointer puVar1;
  ushort uVar2;
  size_t sVar3;
  ushort uVar4;
  pointer local_88;
  BN S;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  puVar1 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(exponent->ba).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1) < 3) && (*puVar1 == 0)) {
    bn1();
  }
  else {
    bn1();
    operator%(&S,this,mod);
    sVar3 = bitCount(exponent);
    local_88 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
    uVar2 = 1;
    while (sVar3 != 0) {
      uVar4 = 1;
      if (1 < uVar2) {
        uVar4 = uVar2;
      }
      if ((local_88[uVar2 == 0] & uVar4) != 0) {
        karatsubaMultiplication((BN *)&local_60,__return_storage_ptr__,&S);
        operator%((BN *)&local_48,(BN *)&local_60,mod);
        operator=(__return_storage_ptr__,(BN *)&local_48);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60)
        ;
      }
      if (sVar3 != 1) {
        Qrt((BN *)&local_60,&S);
        operator%((BN *)&local_48,(BN *)&local_60,mod);
        operator=(&S,(BN *)&local_48);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_60)
        ;
      }
      local_88 = local_88 + (uVar2 == 0);
      uVar2 = uVar4 * 2;
      sVar3 = sVar3 - 1;
    }
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&S);
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expRightToLeft(const BN& exponent, const BN& mod) const {
    if(exponent.is0())
        return BN::bn1();

    BN result(BN::bn1());
    BN S = *this % mod;

    size_t len = exponent.bitCount();
    bt mask = 1;
    const bt *curr = &*exponent.ba.begin();
    for(size_t i = 0; i < len; i++) {
        if(!mask) {
            mask = 1;
            ++curr;
        }
        if(*curr & mask)
            result = move(result * S % mod);

        if (i + 1 != len)
            S = move(S.Qrt() % mod);
        mask <<= 1;
    }
    return result;
}